

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ContainTest.cpp
# Opt level: O2

void __thiscall
oout::ContainTest::ContainTest
          (ContainTest *this,shared_ptr<const_oout::Text> *text,shared_ptr<const_oout::Match> *match
          )

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  shared_ptr<const_oout::Text> local_18;
  
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__ContainTest_001ccf68;
  std::
  make_shared<oout::MatchTest,std::shared_ptr<oout::Text_const>const&,std::shared_ptr<oout::Match_const>const&>
            (&local_18,(shared_ptr<const_oout::Match> *)text);
  _Var1._M_pi = local_18.super___shared_ptr<const_oout::Text,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  local_18.super___shared_ptr<const_oout::Text,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->test).super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_18.super___shared_ptr<const_oout::Text,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (this->test).super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var1._M_pi;
  local_18.super___shared_ptr<const_oout::Text,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_18.super___shared_ptr<const_oout::Text,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  return;
}

Assistant:

ContainTest::ContainTest(
	const shared_ptr<const Text> &text,
	const shared_ptr<const Match> &match
) : test(make_shared<MatchTest>(text, match))
{
}